

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firm_update.c
# Opt level: O2

int input_bin(char *fname,int *length)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    uVar2 = 0;
    while( true ) {
      iVar1 = fgetc(__stream);
      if ((iVar1 == -1) || (0x7fffff < uVar2)) break;
      filebuffer[uVar2] = (char)iVar1;
      uVar2 = uVar2 + 1;
    }
    *length = (int)uVar2;
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int input_bin(char *fname, int *length)
{
    FILE *fp;
 
	int cc = 0, c;

    fp = fopen(fname, "rb");
    if(fp == NULL) 
        return 0;
	while (((c = fgetc(fp)) != EOF) && (cc < FWBUFSIZE))
		filebuffer[cc++] = (uint8)c;
	*length = cc;
	fclose(fp);
	return 1;
}